

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil_time.c
# Opt level: O0

evutil_monotonic_timer * evutil_monotonic_timer_new(void)

{
  evutil_monotonic_timer *__s;
  evutil_monotonic_timer *p;
  
  __s = (evutil_monotonic_timer *)event_mm_malloc_(0x28);
  if (__s != (evutil_monotonic_timer *)0x0) {
    memset(__s,0,0x28);
  }
  return __s;
}

Assistant:

struct evutil_monotonic_timer *
evutil_monotonic_timer_new(void)
{
  struct evutil_monotonic_timer *p = NULL;

  p = mm_malloc(sizeof(*p));
  if (!p) goto done;

  memset(p, 0, sizeof(*p));

 done:
  return p;
}